

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classviewer.cpp
# Opt level: O2

char * getFormattedConstant(cp_info *constantPool,u2 index)

{
  byte bVar1;
  u2 uVar2;
  u4 uVar3;
  u1 *puVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  size_t sVar11;
  char *__dest;
  ulong uVar12;
  ostream *poVar13;
  ushort index_00;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  double dVar18;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar15 = (ulong)index;
switchD_00112557_caseD_7:
  uVar17 = uVar15 & 0xffff;
  bVar1 = constantPool[uVar17 - 1].tag;
  if (0xb < bVar1 - 1) goto switchD_00112557_caseD_2;
  uVar14 = constantPool[uVar17 - 1].info.long_info.high_bytes;
  uVar15 = (ulong)uVar14;
  index_00 = (ushort)uVar14;
  switch((uint)bVar1) {
  case 1:
    goto switchD_00112557_caseD_1;
  case 2:
switchD_00112557_caseD_2:
    poVar13 = std::operator<<((ostream *)&std::cerr,"Arquivo .class possui uma tag ");
    poVar13 = std::operator<<(poVar13,bVar1);
    poVar13 = std::operator<<(poVar13," invalida no pool de constantes.");
    std::endl<char,std::char_traits<char>>(poVar13);
    exit(5);
  case 3:
    pcVar8 = (char *)malloc(100);
    sprintf(pcVar8,"%d",uVar15);
    return pcVar8;
  case 4:
    uVar16 = uVar14 >> 0x17 & 0xff;
    uVar5 = uVar14 & 0x7fffff | 0x800000;
    if (uVar16 == 0) {
      uVar5 = uVar14 * 2 & 0xfffffe;
    }
    uVar7 = -uVar5;
    if (-1 < (int)uVar14) {
      uVar7 = uVar5;
    }
    dVar18 = ldexp(1.0,uVar16 - 0x96);
    pcVar8 = (char *)malloc(100);
    dVar18 = (double)(float)(dVar18 * (double)(int)uVar7);
    goto LAB_001127d2;
  case 5:
    uVar3 = constantPool[uVar17 - 1].info.long_info.low_bytes;
    pcVar8 = (char *)malloc(100);
    sprintf(pcVar8,"%lld",CONCAT44(uVar14,uVar3));
    return pcVar8;
  case 6:
    uVar12 = CONCAT44(uVar14,constantPool[uVar17 - 1].info.long_info.low_bytes);
    uVar14 = uVar14 >> 0x14 & 0x7ff;
    uVar17 = (uVar12 & 0xfffffffffffff) + 0x10000000000000;
    if (uVar14 == 0) {
      uVar17 = uVar12 * 2 & 0x1ffffffffffffe;
    }
    uVar12 = -uVar17;
    if (-1 < (long)(uVar15 << 0x20)) {
      uVar12 = uVar17;
    }
    dVar18 = ldexp(1.0,uVar14 - 0x433);
    dVar18 = dVar18 * (double)(long)uVar12;
    pcVar8 = (char *)malloc(100);
LAB_001127d2:
    sprintf(pcVar8,"%f",dVar18);
    return pcVar8;
  default:
    goto switchD_00112557_caseD_7;
  case 9:
    uVar2 = constantPool[(ulong)(uVar14 >> 0x10) - 1].info.fieldref_info.class_index;
    pcVar8 = getFormattedConstant(constantPool,index_00);
    pcVar9 = getFormattedConstant(constantPool,uVar2);
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar13 = std::operator<<(local_1a8,pcVar8);
    poVar13 = std::operator<<(poVar13,".");
    std::operator<<(poVar13,pcVar9);
    pcVar8 = Utils::streamToCString((stringstream *)local_1b8);
    break;
  case 10:
    uVar2 = constantPool[(ulong)(uVar14 >> 0x10) - 1].info.fieldref_info.class_index;
    pcVar8 = getFormattedConstant(constantPool,index_00);
    pcVar9 = getFormattedConstant(constantPool,uVar2);
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar13 = std::operator<<(local_1a8,pcVar8);
    poVar13 = std::operator<<(poVar13,".");
    std::operator<<(poVar13,pcVar9);
    pcVar8 = Utils::streamToCString((stringstream *)local_1b8);
    break;
  case 0xb:
    uVar2 = constantPool[(ulong)(uVar14 >> 0x10) - 1].info.fieldref_info.class_index;
    pcVar8 = getFormattedConstant(constantPool,index_00);
    pcVar9 = getFormattedConstant(constantPool,uVar2);
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar13 = std::operator<<(local_1a8,pcVar8);
    poVar13 = std::operator<<(poVar13,".");
    std::operator<<(poVar13,pcVar9);
    pcVar8 = Utils::streamToCString((stringstream *)local_1b8);
    break;
  case 0xc:
    pcVar8 = getFormattedConstant(constantPool,index_00);
    pcVar9 = getFormattedConstant(constantPool,(u2)(uVar14 >> 0x10));
    sVar10 = strlen(pcVar8);
    sVar11 = strlen(pcVar9);
    __dest = (char *)malloc(sVar10 + sVar11 + 1);
    strcpy(__dest,pcVar8);
    pcVar8 = strcat(__dest,pcVar9);
    return pcVar8;
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return pcVar8;
switchD_00112557_caseD_1:
  puVar4 = constantPool[uVar17 - 1].info.utf8_info.bytes;
  pcVar8 = (char *)malloc((ulong)((uVar14 & 0xffff) + 1));
  uVar15 = 0;
  for (uVar17 = 0; uVar12 = uVar15 & 0xffff, index_00 != uVar17; uVar17 = uVar17 + 1) {
    bVar1 = puVar4[uVar17];
    iVar6 = isprint((uint)bVar1);
    if (iVar6 != 0) {
      uVar15 = (ulong)((int)uVar12 + 1);
      pcVar8[uVar12] = bVar1;
    }
  }
  pcVar8[uVar12] = '\0';
  return pcVar8;
}

Assistant:

const char* getFormattedConstant(cp_info* constantPool, u2 index) {
    cp_info constant = constantPool[index-1];
    
    if (constant.tag == CONSTANT_Class) {
        CONSTANT_Class_info classInfo = constant.info.class_info;
        return getFormattedConstant(constantPool, classInfo.name_index);
    } else if (constant.tag == CONSTANT_Fieldref) {
        CONSTANT_Fieldref_info fieldRefInfo = constant.info.fieldref_info;
        CONSTANT_NameAndType_info nameAndTypeInfo = constantPool[fieldRefInfo.name_and_type_index-1].info.nameAndType_info;
        
        const char *className = getFormattedConstant(constantPool, fieldRefInfo.class_index);
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        
        stringstream ss;
        ss << className << "." << name;
        return Utils::streamToCString(ss);
    } else if (constant.tag == CONSTANT_Methodref) {
        CONSTANT_Methodref_info methodRefInfo = constant.info.methodref_info;
        CONSTANT_NameAndType_info nameAndTypeInfo = constantPool[methodRefInfo.name_and_type_index-1].info.nameAndType_info;
        
        const char *className = getFormattedConstant(constantPool, methodRefInfo.class_index);
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        
        stringstream ss;
        ss << className << "." << name;
        return Utils::streamToCString(ss);
    } else if (constant.tag == CONSTANT_InterfaceMethodref) {
        CONSTANT_InterfaceMethodref_info interfaceMethodRefInfo = constant.info.interfaceMethodref_info;
        CONSTANT_NameAndType_info nameAndTypeInfo = constantPool[interfaceMethodRefInfo.name_and_type_index-1].info.nameAndType_info;
        
        const char *className = getFormattedConstant(constantPool, interfaceMethodRefInfo.class_index);
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        
        stringstream ss;
        ss << className << "." << name;
        return Utils::streamToCString(ss);
    } else if (constant.tag == CONSTANT_String) {
        CONSTANT_String_info stringInfo = constant.info.string_info;
        return getFormattedConstant(constantPool, stringInfo.string_index);
    } else if (constant.tag == CONSTANT_Integer) {
        CONSTANT_Integer_info intInfo = constant.info.integer_info;
        int32_t number = intInfo.bytes;
        char *s = (char*) malloc(sizeof(char)*100);
        sprintf(s, "%d", number);
        return s;
    } else if (constant.tag == CONSTANT_Float) {
        CONSTANT_Float_info floatInfo = constant.info.float_info;
        
        int32_t s = ((floatInfo.bytes >> 31) == 0) ? 1 : -1;
        int32_t e = ((floatInfo.bytes >> 23) & 0xff);
        int32_t m = (e == 0) ? (floatInfo.bytes & 0x7fffff) << 1 : (floatInfo.bytes & 0x7fffff) | 0x800000;
        float number = s * m * pow(2, e-150);
        
        char *str = (char*) malloc(sizeof(char)*100);
        sprintf(str, "%f", number);
        return str;
    } else if (constant.tag == CONSTANT_Long) {
        CONSTANT_Long_info longInfo = constant.info.long_info;
        int64_t number = ((int64_t) longInfo.high_bytes << 32) + longInfo.low_bytes;
        
        char *str = (char*) malloc(sizeof(char)*100);
        sprintf(str, "%lld", number);
        return str;
    } else if (constant.tag == CONSTANT_Double) {
        CONSTANT_Double_info doubleInfo = constant.info.double_info;
        int64_t bytes = ((int64_t) doubleInfo.high_bytes << 32) + doubleInfo.low_bytes;
        
        int32_t s = ((bytes >> 63) == 0) ? 1 : -1;
        int32_t e = (int32_t)((bytes >> 52) & 0x7ffL);
        int64_t m = (e == 0) ? (bytes & 0xfffffffffffffL) << 1 : (bytes & 0xfffffffffffffL) | 0x10000000000000L;
        double number = s * m * pow(2, e-1075);
        
        char *str = (char*) malloc(sizeof(char)*100);
        sprintf(str, "%f", number);
        return str;
    } else if (constant.tag == CONSTANT_NameAndType) {
        CONSTANT_NameAndType_info nameAndTypeInfo = constant.info.nameAndType_info;
        
        const char *name = getFormattedConstant(constantPool, nameAndTypeInfo.name_index);
        const char *descriptor = getFormattedConstant(constantPool, nameAndTypeInfo.descriptor_index);
        
        char *result = (char*) malloc(sizeof(char)*(strlen(name)+strlen(descriptor)) + 1);
        strcpy(result, name);
        strcat(result, descriptor);
        
        return result;
    } else if (constant.tag == CONSTANT_Utf8) {
        CONSTANT_Utf8_info utf8_info = constant.info.utf8_info;
        char *str = (char*) malloc((utf8_info.length + 1) * sizeof(char));
        
        uint16_t j = 0;
        for (uint16_t i = 0; i < utf8_info.length; i++) {
            if (isprint(utf8_info.bytes[i])) str[j++] = utf8_info.bytes[i];
        }
        str[j] = '\0';
        
        return str;
    } else {
        cerr << "Arquivo .class possui uma tag " << constant.tag << " invalida no pool de constantes." << endl;
        exit(5);
    }
    
    return NULL;
}